

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O3

xmlURIPtr xmlParseURIRaw(char *str,int raw)

{
  int iVar1;
  xmlURIPtr uri;
  
  if (str != (char *)0x0) {
    uri = (xmlURIPtr)(*xmlMalloc)(0x58);
    if (uri == (xmlURIPtr)0x0) {
      xmlURIErrMemory("creating URI structure\n");
    }
    else {
      uri->fragment = (char *)0x0;
      *(undefined8 *)&uri->cleanup = 0;
      uri->path = (char *)0x0;
      uri->query = (char *)0x0;
      uri->user = (char *)0x0;
      *(undefined8 *)&uri->port = 0;
      uri->authority = (char *)0x0;
      uri->server = (char *)0x0;
      uri->scheme = (char *)0x0;
      uri->opaque = (char *)0x0;
      uri->query_raw = (char *)0x0;
      if (raw != 0) {
        uri->cleanup = 2;
      }
      iVar1 = xmlParse3986URIReference(uri,str);
      if (iVar1 == 0) {
        return uri;
      }
      xmlFreeURI(uri);
    }
  }
  return (xmlURIPtr)0x0;
}

Assistant:

xmlURIPtr
xmlParseURIRaw(const char *str, int raw) {
    xmlURIPtr uri;
    int ret;

    if (str == NULL)
	return(NULL);
    uri = xmlCreateURI();
    if (uri != NULL) {
        if (raw) {
	    uri->cleanup |= 2;
	}
	ret = xmlParseURIReference(uri, str);
        if (ret) {
	    xmlFreeURI(uri);
	    return(NULL);
	}
    }
    return(uri);
}